

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__bmp_test_raw(stbi__context *s)

{
  stbi_uc sVar1;
  stbi__uint32 sVar2;
  undefined1 local_21;
  int sz;
  int r;
  stbi__context *s_local;
  
  sVar1 = stbi__get8(s);
  if (sVar1 == 'B') {
    sVar1 = stbi__get8(s);
    if (sVar1 == 'M') {
      stbi__get32le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get32le(s);
      sVar2 = stbi__get32le(s);
      local_21 = true;
      if ((((sVar2 != 0xc) && (local_21 = true, sVar2 != 0x28)) && (local_21 = true, sVar2 != 0x38))
         && (local_21 = true, sVar2 != 0x6c)) {
        local_21 = sVar2 == 0x7c;
      }
      s_local._4_4_ = (uint)local_21;
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__bmp_test_raw(stbi__context *s)
{
   int r;
   int sz;
   if (stbi__get8(s) != 'B') return 0;
   if (stbi__get8(s) != 'M') return 0;
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   stbi__get32le(s); // discard data offset
   sz = stbi__get32le(s);
   r = (sz == 12 || sz == 40 || sz == 56 || sz == 108 || sz == 124);
   return r;
}